

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_resampler_set_rate_ratio(ma_resampler *pResampler,float ratio)

{
  ma_result mVar1;
  ma_uint32 sampleRateIn;
  
  if (((pResampler != (ma_resampler *)0x0) && (0.0 < ratio)) &&
     (sampleRateIn = (ma_uint32)(long)(ratio * 1000.0), sampleRateIn != 0)) {
    mVar1 = ma_resampler_set_rate(pResampler,sampleRateIn,1000);
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_resampler_set_rate_ratio(ma_resampler* pResampler, float ratio)
{
    ma_uint32 n;
    ma_uint32 d;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (ratio <= 0) {
        return MA_INVALID_ARGS;
    }

    d = 1000;
    n = (ma_uint32)(ratio * d);

    if (n == 0) {
        return MA_INVALID_ARGS; /* Ratio too small. */
    }

    MA_ASSERT(n != 0);

    return ma_resampler_set_rate(pResampler, n, d);
}